

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall camp::BadType::BadType(BadType *this,Type provided,Type expected)

{
  undefined1 local_c8 [48];
  undefined1 local_98 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  Type local_18;
  Type local_14;
  Type expected_local;
  Type provided_local;
  BadType *this_local;
  
  local_18 = expected;
  local_14 = provided;
  _expected_local = this;
  typeName_abi_cxx11_((BadType *)local_98,provided);
  std::operator+(local_98 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "value of type ");
  std::operator+(local_58,local_98 + 0x20);
  typeName_abi_cxx11_((BadType *)local_c8,local_18);
  std::operator+(local_38,local_58);
  Error::Error(&this->super_Error,local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(local_98 + 0x20));
  std::__cxx11::string::~string((string *)local_98);
  *(undefined ***)&this->super_Error = &PTR__BadType_001fd030;
  return;
}

Assistant:

BadType::BadType(Type provided, Type expected)
    : Error("value of type " + typeName(provided) + " couldn't be converted to type " + typeName(expected))
{
}